

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O2

int run_test_udp_connect(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  void *pvVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b_8;
  int64_t eval_b_22;
  sockaddr_in ext_addr;
  int addrlen;
  sockaddr_in tmp_addr;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  req.data = (void *)(long)iVar1;
  ext_addr.sin_family = 0;
  ext_addr.sin_port = 0;
  ext_addr.sin_addr.s_addr = 0;
  if (req.data == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&server);
    req.data = (void *)(long)iVar1;
    ext_addr.sin_family = 0;
    ext_addr.sin_port = 0;
    ext_addr.sin_addr.s_addr = 0;
    if (req.data == (void *)0x0) {
      iVar1 = uv_udp_bind(&server,(sockaddr *)&lo_addr,0);
      req.data = (void *)(long)iVar1;
      ext_addr.sin_family = 0;
      ext_addr.sin_port = 0;
      ext_addr.sin_addr.s_addr = 0;
      if (req.data == (void *)0x0) {
        iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
        req.data = (void *)(long)iVar1;
        ext_addr.sin_family = 0;
        ext_addr.sin_port = 0;
        ext_addr.sin_addr.s_addr = 0;
        if (req.data == (void *)0x0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_udp_init(puVar2,&client);
          req.data = (void *)(long)iVar1;
          ext_addr.sin_family = 0;
          ext_addr.sin_port = 0;
          ext_addr.sin_addr.s_addr = 0;
          if (req.data == (void *)0x0) {
            buf = uv_buf_init("EXIT",4);
            iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&tmp_addr);
            req.data = (void *)(long)iVar1;
            ext_addr.sin_family = 0;
            ext_addr.sin_port = 0;
            ext_addr.sin_addr.s_addr = 0;
            if (req.data == (void *)0x0) {
              iVar1 = uv_udp_connect(&client,(sockaddr *)&tmp_addr);
              req.data = (void *)(long)iVar1;
              ext_addr.sin_family = 0;
              ext_addr.sin_port = 0;
              ext_addr.sin_addr.s_addr = 0;
              if (req.data == (void *)0x0) {
                iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
                req.data = (void *)(long)iVar1;
                ext_addr.sin_family = 0;
                ext_addr.sin_port = 0;
                ext_addr.sin_addr.s_addr = 0;
                if (req.data == (void *)0x0) {
                  iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,&ext_addr);
                  pvVar3 = (void *)(long)iVar1;
                  eval_b_8 = 0;
                  req.data = pvVar3;
                  if (pvVar3 == (void *)0x0) {
                    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
                    pvVar3 = (void *)(long)iVar1;
                    eval_b_8 = 0;
                    req.data = pvVar3;
                    if (pvVar3 == (void *)0x0) {
                      iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
                      pvVar3 = (void *)(long)iVar1;
                      eval_b_8 = 0;
                      req.data = pvVar3;
                      if (pvVar3 == (void *)0x0) {
                        iVar1 = uv_udp_connect(&client,(sockaddr *)&ext_addr);
                        pvVar3 = (void *)(long)iVar1;
                        eval_b_8 = -0x6a;
                        req.data = pvVar3;
                        if (pvVar3 == (void *)0xffffffffffffff96) {
                          addrlen = 0x10;
                          iVar1 = uv_udp_getpeername(&client,(sockaddr *)&tmp_addr,&addrlen);
                          pvVar3 = (void *)(long)iVar1;
                          eval_b_8 = 0;
                          req.data = pvVar3;
                          if (pvVar3 == (void *)0x0) {
                            iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
                            pvVar3 = (void *)(long)iVar1;
                            eval_b_8 = -0x6a;
                            req.data = pvVar3;
                            if (pvVar3 == (void *)0xffffffffffffff96) {
                              iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
                              req.data = (void *)0x4;
                              eval_b_22 = (int64_t)iVar1;
                              if (eval_b_22 == 4) {
                                iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&ext_addr);
                                pvVar3 = (void *)(long)iVar1;
                                eval_b_8 = -0x6a;
                                req.data = pvVar3;
                                if (pvVar3 == (void *)0xffffffffffffff96) {
                                  iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
                                  pvVar3 = (void *)(long)iVar1;
                                  eval_b_8 = 0;
                                  req.data = pvVar3;
                                  if (pvVar3 == (void *)0x0) {
                                    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
                                    pvVar3 = (void *)(long)iVar1;
                                    eval_b_8 = -0x6b;
                                    req.data = pvVar3;
                                    if (pvVar3 == (void *)0xffffffffffffff95) {
                                      addrlen = 0x10;
                                      iVar1 = uv_udp_getpeername(&client,(sockaddr *)&tmp_addr,
                                                                 &addrlen);
                                      pvVar3 = (void *)(long)iVar1;
                                      eval_b_8 = -0x6b;
                                      req.data = pvVar3;
                                      if (pvVar3 == (void *)0xffffffffffffff95) {
                                        iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr)
                                        ;
                                        req.data = (void *)0x4;
                                        eval_b_22 = (int64_t)iVar1;
                                        if (eval_b_22 == 4) {
                                          iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
                                          pvVar3 = (void *)(long)iVar1;
                                          eval_b_8 = -0x59;
                                          req.data = pvVar3;
                                          if (pvVar3 == (void *)0xffffffffffffffa7) {
                                            iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
                                            pvVar3 = (void *)(long)iVar1;
                                            eval_b_8 = 0;
                                            req.data = pvVar3;
                                            if (pvVar3 == (void *)0x0) {
                                              iVar1 = uv_udp_send(&req,&client,&buf,1,
                                                                  (sockaddr *)&lo_addr,cl_send_cb);
                                              pvVar3 = (void *)(long)iVar1;
                                              eval_b_22 = -0x6a;
                                              if (pvVar3 == (void *)0xffffffffffffff96) {
                                                iVar1 = uv_udp_send(&req,&client,&buf,1,
                                                                    (sockaddr *)0x0,cl_send_cb);
                                                pvVar3 = (void *)(long)iVar1;
                                                eval_b_22 = 0;
                                                if (pvVar3 == (void *)0x0) {
                                                  puVar2 = uv_default_loop();
                                                  uv_run(puVar2,UV_RUN_DEFAULT);
                                                  eval_b_8 = 2;
                                                  eval_b_22 = (int64_t)close_cb_called;
                                                  if (eval_b_22 == 2) {
                                                    eval_b_8 = 4;
                                                    eval_b_22 = (int64_t)sv_recv_cb_called;
                                                    if (eval_b_22 == 4) {
                                                      eval_b_8 = 2;
                                                      eval_b_22 = (int64_t)cl_send_cb_called;
                                                      if (eval_b_22 == 2) {
                                                        eval_b_22 = 0;
                                                        if (client.send_queue_size == 0) {
                                                          eval_b_22 = 0;
                                                          if (server.send_queue_size == 0) {
                                                            puVar2 = uv_default_loop();
                                                            uv_walk(puVar2,close_walk_cb,(void *)0x0
                                                                   );
                                                            uv_run(puVar2,UV_RUN_DEFAULT);
                                                            eval_b_8 = 0;
                                                            puVar2 = uv_default_loop();
                                                            iVar1 = uv_loop_close(puVar2);
                                                            eval_b_22 = (int64_t)iVar1;
                                                            if (eval_b_22 == 0) {
                                                              uv_library_shutdown();
                                                              return 0;
                                                            }
                                                            pcVar6 = 
                                                  "uv_loop_close(uv_default_loop())";
                                                  pcVar5 = "0";
                                                  uVar4 = 0xc2;
                                                  pvVar3 = (void *)eval_b_8;
                                                  }
                                                  else {
                                                    pcVar6 = "0";
                                                    pcVar5 = "server.send_queue_size";
                                                    uVar4 = 0xc0;
                                                    pvVar3 = (void *)server.send_queue_size;
                                                  }
                                                  }
                                                  else {
                                                    pcVar6 = "0";
                                                    pcVar5 = "client.send_queue_size";
                                                    uVar4 = 0xbf;
                                                    pvVar3 = (void *)client.send_queue_size;
                                                  }
                                                  }
                                                  else {
                                                    pcVar6 = "cl_send_cb_called";
                                                    pcVar5 = "2";
                                                    uVar4 = 0xbd;
                                                    pvVar3 = (void *)eval_b_8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar6 = "sv_recv_cb_called";
                                                    pcVar5 = "4";
                                                    uVar4 = 0xbc;
                                                    pvVar3 = (void *)eval_b_8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar6 = "close_cb_called";
                                                    pcVar5 = "2";
                                                    uVar4 = 0xbb;
                                                    pvVar3 = (void *)eval_b_8;
                                                  }
                                                }
                                                else {
                                                  pcVar6 = "0";
                                                  pcVar5 = "r";
                                                  uVar4 = 0xb7;
                                                }
                                              }
                                              else {
                                                pcVar6 = "UV_EISCONN";
                                                pcVar5 = "r";
                                                uVar4 = 0xb5;
                                              }
                                            }
                                            else {
                                              pcVar6 = "0";
                                              pcVar5 = "r";
                                              uVar4 = 0xae;
                                              eval_b_22 = eval_b_8;
                                            }
                                          }
                                          else {
                                            pcVar6 = "UV_EDESTADDRREQ";
                                            pcVar5 = "r";
                                            uVar4 = 0xaa;
                                            eval_b_22 = eval_b_8;
                                          }
                                        }
                                        else {
                                          pcVar6 = "r";
                                          pcVar5 = "4";
                                          uVar4 = 0xa8;
                                          pvVar3 = req.data;
                                        }
                                      }
                                      else {
                                        pcVar6 = "UV_ENOTCONN";
                                        pcVar5 = "r";
                                        uVar4 = 0xa4;
                                        eval_b_22 = eval_b_8;
                                      }
                                    }
                                    else {
                                      pcVar6 = "UV_ENOTCONN";
                                      pcVar5 = "r";
                                      uVar4 = 0xa0;
                                      eval_b_22 = eval_b_8;
                                    }
                                  }
                                  else {
                                    pcVar6 = "0";
                                    pcVar5 = "r";
                                    uVar4 = 0x9e;
                                    eval_b_22 = eval_b_8;
                                  }
                                }
                                else {
                                  pcVar6 = "UV_EISCONN";
                                  pcVar5 = "r";
                                  uVar4 = 0x9b;
                                  eval_b_22 = eval_b_8;
                                }
                              }
                              else {
                                pcVar6 = "r";
                                pcVar5 = "4";
                                uVar4 = 0x99;
                                pvVar3 = req.data;
                              }
                            }
                            else {
                              pcVar6 = "UV_EISCONN";
                              pcVar5 = "r";
                              uVar4 = 0x97;
                              eval_b_22 = eval_b_8;
                            }
                          }
                          else {
                            pcVar6 = "0";
                            pcVar5 = "r";
                            uVar4 = 0x93;
                            eval_b_22 = eval_b_8;
                          }
                        }
                        else {
                          pcVar6 = "UV_EISCONN";
                          pcVar5 = "r";
                          uVar4 = 0x8f;
                          eval_b_22 = eval_b_8;
                        }
                      }
                      else {
                        pcVar6 = "0";
                        pcVar5 = "r";
                        uVar4 = 0x8d;
                        eval_b_22 = eval_b_8;
                      }
                    }
                    else {
                      pcVar6 = "0";
                      pcVar5 = "uv_ip4_addr(\"127.0.0.1\", 9123, &lo_addr)";
                      uVar4 = 0x8a;
                      eval_b_22 = eval_b_8;
                    }
                  }
                  else {
                    pcVar6 = "0";
                    pcVar5 = "uv_ip4_addr(\"8.8.8.8\", 9123, &ext_addr)";
                    uVar4 = 0x89;
                    eval_b_22 = eval_b_8;
                  }
                  goto LAB_0019eae6;
                }
                pcVar5 = "r";
                uVar4 = 0x86;
              }
              else {
                pcVar5 = "r";
                uVar4 = 0x84;
              }
            }
            else {
              pcVar5 = "uv_ip4_addr(\"0.0.0.0\", 9123, &tmp_addr)";
              uVar4 = 0x7f;
            }
          }
          else {
            pcVar5 = "r";
            uVar4 = 0x7a;
          }
        }
        else {
          pcVar5 = "r";
          uVar4 = 0x77;
        }
      }
      else {
        pcVar5 = "r";
        uVar4 = 0x74;
      }
    }
    else {
      pcVar5 = "r";
      uVar4 = 0x71;
    }
  }
  else {
    pcVar5 = "uv_ip4_addr(\"0.0.0.0\", 9123, &lo_addr)";
    uVar4 = 0x6e;
  }
  ext_addr.sin_family = 0;
  ext_addr.sin_port = 0;
  ext_addr.sin_addr.s_addr = 0;
  pcVar6 = "0";
  eval_b_22 = 0;
  pvVar3 = req.data;
LAB_0019eae6:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
          ,uVar4,pcVar5,"==",pcVar6,pvVar3,"==",eval_b_22);
  abort();
}

Assistant:

TEST_IMPL(udp_connect) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  buf = uv_buf_init("EXIT", 4);

  /* connect() to INADDR_ANY fails on Windows with WSAEADDRNOTAVAIL */
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &tmp_addr));
  r = uv_udp_connect(&client, (const struct sockaddr*) &tmp_addr);
#ifdef _WIN32
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);
#else
  ASSERT_OK(r);
  r = uv_udp_connect(&client, NULL);
  ASSERT_OK(r);
#endif

  ASSERT_OK(uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT_OK(r);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT_EQ(r, UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT_OK(r);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT_EQ(r, UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT_EQ(4, r);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT_EQ(r, UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT_OK(r);
  r = uv_udp_connect(&client, NULL);
  ASSERT_EQ(r, UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT_EQ(r, UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT_EQ(4, r);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT_EQ(r, UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT_OK(r);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT_EQ(r, UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(4, sv_recv_cb_called);
  ASSERT_EQ(2, cl_send_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}